

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall gl4cts::GPUShaderFP64Test4::generateUniformValues(GPUShaderFP64Test4 *this)

{
  uint n_stage;
  long lVar1;
  uint n_double_ptr;
  long lVar2;
  _stage_data *local_278 [6];
  _stage_data *local_248;
  double *local_240;
  double *local_238;
  double *local_230;
  double *local_228;
  double *local_220;
  double *local_218;
  double *local_210;
  double *local_208;
  double *local_200;
  double *local_1f8;
  double *local_1f0;
  double *local_1e8;
  double *local_1e0;
  double *local_1d8;
  double *local_1d0;
  double *local_1c8;
  double *local_1c0;
  double *local_1b8;
  double *local_1b0;
  double *local_1a8;
  _data *local_1a0;
  double *local_198;
  double *local_190;
  double *local_188;
  double *local_180;
  double *local_178;
  double *local_170;
  double *local_168;
  double *local_160;
  double *local_158;
  double *local_150;
  double *local_148;
  double *local_140;
  double *local_138;
  double *local_130;
  double *local_128;
  double *local_120;
  double *local_118;
  double *local_110;
  double *local_108;
  double *local_100;
  _data *local_f8;
  double *local_f0;
  double *local_e8;
  double *local_e0;
  double *local_d8;
  double *local_d0;
  double *local_c8;
  double *local_c0;
  double *local_b8;
  double *local_b0;
  double *local_a8;
  double *local_a0;
  double *local_98;
  double *local_90;
  double *local_88;
  _stage_data *stages [6];
  
  local_278[0] = &this->m_data_cs;
  local_278[1] = &this->m_data_fs;
  local_278[2] = &this->m_data_gs;
  local_278[3] = &this->m_data_tc;
  local_278[4] = &this->m_data_te;
  local_278[5] = &this->m_data_vs;
  lVar1 = 0;
  do {
    local_248 = local_278[lVar1];
    local_240 = local_248->uniform_structure_arrays[0].uniform_double_arr;
    local_238 = local_248->uniform_structure_arrays[0].uniform_double_arr + 1;
    local_230 = local_248->uniform_structure_arrays[0].uniform_dvec2;
    local_228 = local_248->uniform_structure_arrays[0].uniform_dvec2 + 1;
    local_220 = local_248->uniform_structure_arrays[0].uniform_dvec2_arr;
    local_218 = local_248->uniform_structure_arrays[0].uniform_dvec2_arr + 1;
    local_210 = local_248->uniform_structure_arrays[0].uniform_dvec3;
    local_208 = local_248->uniform_structure_arrays[0].uniform_dvec3 + 1;
    local_200 = local_248->uniform_structure_arrays[0].uniform_dvec3 + 2;
    local_1f8 = local_248->uniform_structure_arrays[0].uniform_dvec3_arr;
    local_1f0 = local_248->uniform_structure_arrays[0].uniform_dvec3_arr + 1;
    local_1e8 = local_248->uniform_structure_arrays[0].uniform_dvec3_arr + 2;
    local_1e0 = local_248->uniform_structure_arrays[0].uniform_dvec4;
    local_1d8 = local_248->uniform_structure_arrays[0].uniform_dvec4 + 1;
    local_1d0 = local_248->uniform_structure_arrays[0].uniform_dvec4 + 2;
    local_1c8 = local_248->uniform_structure_arrays[0].uniform_dvec4 + 3;
    local_1c0 = local_248->uniform_structure_arrays[0].uniform_dvec4_arr;
    local_1b8 = local_248->uniform_structure_arrays[0].uniform_dvec4_arr + 1;
    local_1b0 = local_248->uniform_structure_arrays[0].uniform_dvec4_arr + 2;
    local_1a8 = local_248->uniform_structure_arrays[0].uniform_dvec4_arr + 3;
    local_1a0 = local_248->uniform_structure_arrays + 1;
    local_198 = local_248->uniform_structure_arrays[1].uniform_double_arr;
    local_190 = local_248->uniform_structure_arrays[1].uniform_double_arr + 1;
    local_188 = local_248->uniform_structure_arrays[1].uniform_dvec2;
    local_180 = local_248->uniform_structure_arrays[1].uniform_dvec2 + 1;
    local_178 = local_248->uniform_structure_arrays[1].uniform_dvec2_arr;
    local_170 = local_248->uniform_structure_arrays[1].uniform_dvec2_arr + 1;
    local_168 = local_248->uniform_structure_arrays[1].uniform_dvec3;
    local_160 = local_248->uniform_structure_arrays[1].uniform_dvec3 + 1;
    local_158 = local_248->uniform_structure_arrays[1].uniform_dvec3 + 2;
    local_150 = local_248->uniform_structure_arrays[1].uniform_dvec3_arr;
    local_148 = local_248->uniform_structure_arrays[1].uniform_dvec3_arr + 1;
    local_140 = local_248->uniform_structure_arrays[1].uniform_dvec3_arr + 2;
    local_138 = local_248->uniform_structure_arrays[1].uniform_dvec4;
    local_130 = local_248->uniform_structure_arrays[1].uniform_dvec4 + 1;
    local_128 = local_248->uniform_structure_arrays[1].uniform_dvec4 + 2;
    local_120 = local_248->uniform_structure_arrays[1].uniform_dvec4 + 3;
    local_118 = local_248->uniform_structure_arrays[1].uniform_dvec4_arr;
    local_110 = local_248->uniform_structure_arrays[1].uniform_dvec4_arr + 1;
    local_108 = local_248->uniform_structure_arrays[1].uniform_dvec4_arr + 2;
    local_100 = local_248->uniform_structure_arrays[1].uniform_dvec4_arr + 3;
    local_f8 = &local_248->uniforms;
    local_f0 = (local_248->uniforms).uniform_double_arr;
    local_e8 = (local_248->uniforms).uniform_double_arr + 1;
    local_e0 = (local_248->uniforms).uniform_dvec2;
    local_d8 = (local_248->uniforms).uniform_dvec2 + 1;
    local_d0 = (local_248->uniforms).uniform_dvec2_arr;
    local_c8 = (local_248->uniforms).uniform_dvec2_arr + 1;
    local_c0 = (local_248->uniforms).uniform_dvec2_arr + 2;
    local_b8 = (local_248->uniforms).uniform_dvec2_arr + 3;
    local_b0 = (local_248->uniforms).uniform_dvec3;
    local_a8 = (local_248->uniforms).uniform_dvec3 + 1;
    local_a0 = (local_248->uniforms).uniform_dvec3 + 2;
    local_98 = (local_248->uniforms).uniform_dvec3_arr;
    local_90 = (local_248->uniforms).uniform_dvec3_arr + 1;
    local_88 = (local_248->uniforms).uniform_dvec3_arr + 2;
    stages[0] = (_stage_data *)((local_248->uniforms).uniform_dvec3_arr + 3);
    stages[1] = (_stage_data *)((local_248->uniforms).uniform_dvec3_arr + 4);
    stages[2] = (_stage_data *)((local_248->uniforms).uniform_dvec3_arr + 5);
    stages[3] = (_stage_data *)(local_248->uniforms).uniform_dvec4;
    stages[4] = (_stage_data *)((local_248->uniforms).uniform_dvec4 + 1);
    stages[5] = (_stage_data *)((local_248->uniforms).uniform_dvec4 + 2);
    lVar2 = 0;
    do {
      (&local_248)[lVar2]->uniform_structure_arrays[0].uniform_double =
           (double)(int)(-(generateUniformValues::seed & 1U) | 1) *
           ((double)(generateUniformValues::seed % 0x6c4) / 125.7);
      generateUniformValues::seed = generateUniformValues::seed + 0x2ef;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x48);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 6);
  return;
}

Assistant:

void GPUShaderFP64Test4::generateUniformValues()
{
	_stage_data*	   stages[] = { &m_data_cs, &m_data_fs, &m_data_gs, &m_data_tc, &m_data_te, &m_data_vs };
	const unsigned int n_stages = sizeof(stages) / sizeof(stages[0]);

	for (unsigned int n_stage = 0; n_stage < n_stages; ++n_stage)
	{
		_stage_data* stage_ptr = stages[n_stage];

		/* Iterate through all uniform components and assign them double values */
		double* double_ptrs[] = {
			&stage_ptr->uniform_structure_arrays[0].uniform_double,
			stage_ptr->uniform_structure_arrays[0].uniform_double_arr + 0,
			stage_ptr->uniform_structure_arrays[0].uniform_double_arr + 1,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec2 + 0,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec2 + 1,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec2 + 2,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec2 + 3,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec3 + 0,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec3 + 1,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec3 + 2,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec3 + 3,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec3 + 4,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec3 + 5,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 0,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 1,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 2,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 3,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 4,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 5,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 6,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 7,
			&stage_ptr->uniform_structure_arrays[1].uniform_double,
			stage_ptr->uniform_structure_arrays[1].uniform_double_arr + 0,
			stage_ptr->uniform_structure_arrays[1].uniform_double_arr + 1,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec2 + 0,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec2 + 1,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec2 + 2,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec2 + 3,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec3 + 0,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec3 + 1,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec3 + 2,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec3 + 3,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec3 + 4,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec3 + 5,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 0,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 1,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 2,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 3,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 4,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 5,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 6,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 7,
			&stage_ptr->uniforms.uniform_double,
			stage_ptr->uniforms.uniform_double_arr + 0,
			stage_ptr->uniforms.uniform_double_arr + 1,
			stage_ptr->uniforms.uniform_dvec2 + 0,
			stage_ptr->uniforms.uniform_dvec2 + 1,
			stage_ptr->uniforms.uniform_dvec2_arr + 0,
			stage_ptr->uniforms.uniform_dvec2_arr + 1,
			stage_ptr->uniforms.uniform_dvec2_arr + 2,
			stage_ptr->uniforms.uniform_dvec2_arr + 3,
			stage_ptr->uniforms.uniform_dvec3 + 0,
			stage_ptr->uniforms.uniform_dvec3 + 1,
			stage_ptr->uniforms.uniform_dvec3 + 2,
			stage_ptr->uniforms.uniform_dvec3_arr + 0,
			stage_ptr->uniforms.uniform_dvec3_arr + 1,
			stage_ptr->uniforms.uniform_dvec3_arr + 2,
			stage_ptr->uniforms.uniform_dvec3_arr + 3,
			stage_ptr->uniforms.uniform_dvec3_arr + 4,
			stage_ptr->uniforms.uniform_dvec3_arr + 5,
			stage_ptr->uniforms.uniform_dvec4 + 0,
			stage_ptr->uniforms.uniform_dvec4 + 1,
			stage_ptr->uniforms.uniform_dvec4 + 2,
			stage_ptr->uniforms.uniform_dvec4 + 3,
			stage_ptr->uniforms.uniform_dvec4_arr + 0,
			stage_ptr->uniforms.uniform_dvec4_arr + 1,
			stage_ptr->uniforms.uniform_dvec4_arr + 2,
			stage_ptr->uniforms.uniform_dvec4_arr + 3,
			stage_ptr->uniforms.uniform_dvec4_arr + 4,
			stage_ptr->uniforms.uniform_dvec4_arr + 5,
			stage_ptr->uniforms.uniform_dvec4_arr + 6,
			stage_ptr->uniforms.uniform_dvec4_arr + 7,
		};
		const unsigned int n_double_ptrs = sizeof(double_ptrs) / sizeof(double_ptrs[0]);

		for (unsigned int n_double_ptr = 0; n_double_ptr < n_double_ptrs; ++n_double_ptr)
		{
			double* double_ptr = double_ptrs[n_double_ptr];

			/* Generate the value. Use magic numbers to generate a set of double-precision
			 * floating-point numbers.
			 */
			static int seed = 16762362;

			*double_ptr = ((double)(seed % 1732)) / 125.7 * (((seed % 2) == 0) ? 1 : -1);

			seed += 751;
		} /* for (all pointers to double variables) */
	}	 /* for (all stages) */
}